

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O2

void ImStb::stb_textedit_find_charpos
               (StbFindState *find,ImGuiInputTextState *str,int n,int single_line)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  StbTexteditRow r;
  StbTexteditRow local_48;
  
  if (str->CurLenW == n) {
    if (single_line == 0) {
      find->x = 0.0;
      find->y = 0.0;
      find->height = 1.0;
      iVar2 = 0;
      iVar3 = 0;
      while (iVar1 = iVar2, iVar1 < n) {
        STB_TEXTEDIT_LAYOUTROW(&local_48,str,iVar1);
        iVar3 = iVar1;
        iVar2 = local_48.num_chars + iVar1;
      }
      find->first_char = iVar1;
      find->length = 0;
      find->prev_first = iVar3;
    }
    else {
      STB_TEXTEDIT_LAYOUTROW(&local_48,str,0);
      find->y = 0.0;
      find->first_char = 0;
      find->length = n;
      find->height = local_48.ymax - local_48.ymin;
      find->x = local_48.x1;
    }
  }
  else {
    fVar4 = 0.0;
    iVar2 = 0;
    iVar3 = 0;
    while( true ) {
      iVar1 = iVar2;
      find->y = fVar4;
      STB_TEXTEDIT_LAYOUTROW(&local_48,str,iVar1);
      if (n < local_48.num_chars + iVar1) break;
      fVar4 = local_48.baseline_y_delta + find->y;
      iVar2 = local_48.num_chars + iVar1;
      iVar3 = iVar1;
    }
    find->first_char = iVar1;
    find->length = local_48.num_chars;
    find->height = local_48.ymax - local_48.ymin;
    find->prev_first = iVar3;
    find->x = local_48.x0;
    for (iVar2 = 0; iVar1 + iVar2 < n; iVar2 = iVar2 + 1) {
      fVar4 = STB_TEXTEDIT_GETWIDTH(str,iVar1,iVar2);
      find->x = fVar4 + find->x;
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}